

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O1

size_t bssl::dtls_seal_max_input_len(SSL *ssl,uint16_t epoch,size_t max_out)

{
  byte bVar1;
  DTLS1_STATE *pDVar2;
  uint16_t uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  DTLSWriteEpoch *pDVar7;
  
  pDVar2 = ssl->d1;
  if (*(uint16_t *)((long)&(pDVar2->write_epoch).next_record.combined_ + 6) == epoch) {
    pDVar7 = &pDVar2->write_epoch;
  }
  else {
    bVar1 = (pDVar2->extra_write_epochs).size_;
    if (bVar1 != 0) {
      lVar6 = 0;
      do {
        pDVar7 = *(DTLSWriteEpoch **)((pDVar2->extra_write_epochs).storage_ + lVar6);
        if (*(uint16_t *)((long)&(pDVar7->next_record).combined_ + 6) == epoch) goto LAB_00170acc;
        lVar6 = lVar6 + 8;
      } while ((ulong)bVar1 * 8 != lVar6);
    }
    pDVar7 = (DTLSWriteEpoch *)0x0;
  }
LAB_00170acc:
  if (pDVar7 != (DTLSWriteEpoch *)0x0) {
    if (ssl->s3->version == 0) {
      uVar4 = 0xd;
    }
    else {
      uVar3 = ssl_protocol_version(ssl);
      uVar4 = 0xd;
      if (epoch != 0) {
        uVar4 = (ulong)(uVar3 < 0x304) * 8 + 5;
      }
    }
    if ((uVar4 <= max_out && max_out - uVar4 != 0) &&
       (sVar5 = SSLAEADContext::MaxSealInputLen
                          ((pDVar7->aead)._M_t.
                           super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,
                           max_out - uVar4), sVar5 != 0)) {
      if (ssl->s3->version == 0) {
        lVar6 = 0;
      }
      else {
        uVar3 = ssl_protocol_version(ssl);
        lVar6 = -(ulong)(epoch != 0 && 0x303 < uVar3);
      }
      return lVar6 + sVar5;
    }
  }
  return 0;
}

Assistant:

size_t dtls_seal_max_input_len(const SSL *ssl, uint16_t epoch, size_t max_out) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t header_len = dtls_record_header_write_len(ssl, epoch);
  if (max_out <= header_len) {
    return 0;
  }
  max_out -= header_len;
  max_out = write_epoch->aead->MaxSealInputLen(max_out);
  if (max_out > 0 && use_dtls13_record_header(ssl, epoch)) {
    // Remove 1 byte for the encrypted record type.
    max_out--;
  }
  return max_out;
}